

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O1

DirectorySnapshotDiff * __thiscall
efsw::DirectorySnapshot::scan(DirectorySnapshotDiff *__return_storage_ptr__,DirectorySnapshot *this)

{
  FileInfoMap *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__k;
  pointer pcVar2;
  bool bVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  _Base_ptr p_Var7;
  FileInfoList *pFVar8;
  DirectorySnapshotDiff *this_01;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  pVar9;
  string oldFile;
  FileInfoMap FilesCpy;
  FileInfoMap files;
  FileInfo curFI;
  FileInfo fi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
  *local_1c8;
  vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
  *local_1c0;
  FileInfoList *local_1b8;
  FileInfoList *local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  local_1a8;
  string local_178;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
  local_128;
  FileInfo local_c0;
  FileInfo local_78;
  
  memset(__return_storage_ptr__,0,0xc0);
  DirectorySnapshotDiff::clear(__return_storage_ptr__);
  FileInfo::FileInfo(&local_c0,(string *)this);
  bVar3 = FileInfo::operator!=(&this->DirectoryInfo,&local_c0);
  __return_storage_ptr__->DirChanged = bVar3;
  if (bVar3) {
    FileInfo::operator=(&this->DirectoryInfo,&local_c0);
  }
  bVar3 = FileInfo::exists(&local_c0);
  if (bVar3) {
    pcVar2 = (this->DirectoryInfo).Filepath._M_dataplus._M_p;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar2,pcVar2 + (this->DirectoryInfo).Filepath._M_string_length)
    ;
    FileSystem::filesInfoFromPath((FileInfoMap *)&local_158,&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
        local_158._M_impl.super__Rb_tree_header._M_node_count != 0) {
      FileInfo::FileInfo(&local_78);
      local_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1a8._M_impl.super__Rb_tree_header._M_header;
      local_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (__return_storage_ptr__->DirChanged == true) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ::operator=(&local_1a8,&(this->Files)._M_t);
      }
      if ((_Rb_tree_header *)local_158._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_158._M_impl.super__Rb_tree_header) {
        this_00 = &this->Files;
        p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
        local_1c0 = (vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
                     *)&__return_storage_ptr__->FilesMoved;
        local_1c8 = (vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
                     *)&__return_storage_ptr__->DirsMoved;
        local_1b0 = &__return_storage_ptr__->FilesCreated;
        local_1b8 = &__return_storage_ptr__->DirsCreated;
        p_Var7 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          FileInfo::operator=(&local_78,(FileInfo *)(p_Var7 + 2));
          __k = p_Var7 + 1;
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  ::find(&this_00->_M_t,(key_type *)__k);
          if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
            bVar3 = FileInfo::isRegularFile(&local_78);
            if (!bVar3) {
              bVar3 = FileInfo::isDirectory(&local_78);
              if (!bVar3) goto LAB_00112fff;
            }
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                     ::operator[](this_00,(key_type *)__k);
            FileInfo::operator=(pmVar5,&local_78);
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
            iVar6 = nodeInFiles_abi_cxx11_(this,&local_78);
            if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
              bVar3 = FileInfo::isDirectory(&local_78);
              pFVar8 = local_1b0;
              if (bVar3) {
                pFVar8 = local_1b8;
              }
              std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                        (pFVar8,&local_78);
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_1e8);
              pVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                      ::equal_range(&local_1a8,(key_type *)(iVar6._M_node + 1));
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ::_M_erase_aux(&local_1a8,(_Base_ptr)pVar9.first._M_node,
                             (_Base_ptr)pVar9.second._M_node);
              pVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                      ::equal_range(&this_00->_M_t,(key_type *)(iVar6._M_node + 1));
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar9.first._M_node,
                             (_Base_ptr)pVar9.second._M_node);
              bVar3 = FileInfo::isDirectory(&local_78);
              if (bVar3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_efsw::FileInfo_&,_true>
                          (&local_128,&local_1e8,&local_78);
                std::
                vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
                ::emplace_back<std::pair<std::__cxx11::string,efsw::FileInfo>>(local_1c8,&local_128)
                ;
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_efsw::FileInfo_&,_true>
                          (&local_128,&local_1e8,&local_78);
                std::
                vector<std::pair<std::__cxx11::string,efsw::FileInfo>,std::allocator<std::pair<std::__cxx11::string,efsw::FileInfo>>>
                ::emplace_back<std::pair<std::__cxx11::string,efsw::FileInfo>>(local_1c0,&local_128)
                ;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128.second.Filepath._M_dataplus._M_p !=
                  &local_128.second.Filepath.field_2) {
                operator_delete(local_128.second.Filepath._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128.first._M_dataplus._M_p != &local_128.first.field_2) {
                operator_delete(local_128.first._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p);
            }
          }
          else {
            pVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                    ::equal_range(&local_1a8,(key_type *)__k);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            ::_M_erase_aux(&local_1a8,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node
                          );
            bVar3 = FileInfo::operator!=((FileInfo *)(iVar4._M_node + 2),&local_78);
            if (bVar3) {
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                       ::operator[](this_00,(key_type *)__k);
              FileInfo::operator=(pmVar5,&local_78);
              bVar3 = FileInfo::isDirectory(&local_78);
              pFVar8 = &__return_storage_ptr__->FilesModified;
              if (bVar3) {
                pFVar8 = &__return_storage_ptr__->DirsModified;
              }
              std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                        (pFVar8,&local_78);
            }
          }
LAB_00112fff:
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while ((_Rb_tree_header *)p_Var7 != &local_158._M_impl.super__Rb_tree_header);
      }
      if ((__return_storage_ptr__->DirChanged == true) &&
         ((_Rb_tree_header *)local_1a8._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_1a8._M_impl.super__Rb_tree_header)) {
        p_Var7 = local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          FileInfo::operator=(&local_78,(FileInfo *)(p_Var7 + 2));
          bVar3 = FileInfo::isDirectory(&local_78);
          this_01 = __return_storage_ptr__;
          if (bVar3) {
            this_01 = (DirectorySnapshotDiff *)&__return_storage_ptr__->DirsDeleted;
          }
          std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
                    (&this_01->FilesDeleted,&local_78);
          pVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                  ::equal_range(&(this->Files)._M_t,(key_type *)(p_Var7 + 1));
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
          ::_M_erase_aux(&(this->Files)._M_t,(_Base_ptr)pVar9.first._M_node,
                         (_Base_ptr)pVar9.second._M_node);
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while ((_Rb_tree_header *)p_Var7 != &local_1a8._M_impl.super__Rb_tree_header);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
      ::~_Rb_tree(&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
        operator_delete(local_78.Filepath._M_dataplus._M_p);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~_Rb_tree(&local_158);
  }
  else {
    deleteAll(this,__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.Filepath._M_dataplus._M_p != &local_c0.Filepath.field_2) {
    operator_delete(local_c0.Filepath._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

DirectorySnapshotDiff DirectorySnapshot::scan() {
	DirectorySnapshotDiff Diff;

	Diff.clear();

	FileInfo curFI( DirectoryInfo.Filepath );

	Diff.DirChanged = DirectoryInfo != curFI;

	if ( Diff.DirChanged ) {
		DirectoryInfo = curFI;
	}

	/// If the directory was erased, create the events for files and directories deletion
	if ( !curFI.exists() ) {
		deleteAll( Diff );

		return Diff;
	}

	FileInfoMap files = FileSystem::filesInfoFromPath( DirectoryInfo.Filepath );

	if ( files.empty() && Files.empty() ) {
		return Diff;
	}

	FileInfo fi;
	FileInfoMap FilesCpy;
	FileInfoMap::iterator it;
	FileInfoMap::iterator fiIt;

	if ( Diff.DirChanged ) {
		FilesCpy = Files;
	}

	for ( it = files.begin(); it != files.end(); it++ ) {
		fi = it->second;

		/// File existed before?
		fiIt = Files.find( it->first );

		if ( fiIt != Files.end() ) {
			/// Erase from the file list copy
			FilesCpy.erase( it->first );

			/// File changed?
			if ( ( *fiIt ).second != fi ) {
				/// Update the new file info
				Files[it->first] = fi;

				/// handle modified event
				if ( fi.isDirectory() ) {
					Diff.DirsModified.push_back( fi );
				} else {
					Diff.FilesModified.push_back( fi );
				}
			}
		}
		/// Only add regular files or directories
		else if ( fi.isRegularFile() || fi.isDirectory() ) {
			/// New file found
			Files[it->first] = fi;

			FileInfoMap::iterator fit;
			std::string oldFile = "";

			/// Check if the same inode already existed
			if ( ( fit = nodeInFiles( fi ) ) != Files.end() ) {
				oldFile = fit->first;

				/// Avoid firing a Delete event
				FilesCpy.erase( fit->first );

				/// Delete the old file name
				Files.erase( fit->first );

				if ( fi.isDirectory() ) {
					Diff.DirsMoved.push_back( std::make_pair( oldFile, fi ) );
				} else {
					Diff.FilesMoved.push_back( std::make_pair( oldFile, fi ) );
				}
			} else {
				if ( fi.isDirectory() ) {
					Diff.DirsCreated.push_back( fi );
				} else {
					Diff.FilesCreated.push_back( fi );
				}
			}
		}
	}

	if ( !Diff.DirChanged ) {
		return Diff;
	}

	/// The files or directories that remains were deleted
	for ( it = FilesCpy.begin(); it != FilesCpy.end(); it++ ) {
		fi = it->second;

		if ( fi.isDirectory() ) {
			Diff.DirsDeleted.push_back( fi );
		} else {
			Diff.FilesDeleted.push_back( fi );
		}

		/// Remove the file or directory from the list of files
		Files.erase( it->first );
	}

	return Diff;
}